

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

void archive_entry_copy_mac_metadata(archive_entry *entry,void *p,size_t s)

{
  void *pvVar1;
  size_t in_RDX;
  void *in_RSI;
  long in_RDI;
  
  free(*(void **)(in_RDI + 0x3b8));
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    *(undefined8 *)(in_RDI + 0x3b8) = 0;
    *(undefined8 *)(in_RDI + 0x3c0) = 0;
  }
  else {
    *(size_t *)(in_RDI + 0x3c0) = in_RDX;
    pvVar1 = malloc(in_RDX);
    *(void **)(in_RDI + 0x3b8) = pvVar1;
    if (*(long *)(in_RDI + 0x3b8) == 0) {
      abort();
    }
    memcpy(*(void **)(in_RDI + 0x3b8),in_RSI,in_RDX);
  }
  return;
}

Assistant:

void
archive_entry_copy_mac_metadata(struct archive_entry *entry,
    const void *p, size_t s)
{
  free(entry->mac_metadata);
  if (p == NULL || s == 0) {
    entry->mac_metadata = NULL;
    entry->mac_metadata_size = 0;
  } else {
    entry->mac_metadata_size = s;
    entry->mac_metadata = malloc(s);
    if (entry->mac_metadata == NULL)
      abort();
    memcpy(entry->mac_metadata, p, s);
  }
}